

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script_tests.cpp
# Opt level: O0

void __thiscall script_tests::script_cltv_truncated::test_method(script_cltv_truncated *this)

{
  long lVar1;
  bool bVar2;
  long in_FS_OFFSET;
  ScriptError err;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  stack_ignore;
  CScript script_cltv_trunc;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  *in_stack_fffffffffffffe38;
  lazy_ostream *in_stack_fffffffffffffe40;
  char *in_stack_fffffffffffffe48;
  ScriptError *in_stack_fffffffffffffe50;
  SigVersion in_stack_fffffffffffffe5c;
  lazy_ostream *in_stack_fffffffffffffe60;
  size_t in_stack_fffffffffffffe68;
  size_t line_num;
  undefined7 in_stack_fffffffffffffe70;
  undefined1 in_stack_fffffffffffffe77;
  lazy_ostream *in_stack_fffffffffffffe78;
  lazy_ostream local_13c;
  undefined1 local_128 [64];
  const_string local_e8 [2];
  lazy_ostream local_c8;
  undefined1 local_64 [28];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = 0;
  local_48 = 0;
  uStack_40 = 0;
  CScript::CScript((CScript *)in_stack_fffffffffffffe38);
  CScript::operator<<((CScript *)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70),
                      (opcodetype)(in_stack_fffffffffffffe68 >> 0x20));
  CScript::CScript((CScript *)in_stack_fffffffffffffe38,(CScript *)0xa4e421);
  CScript::~CScript((CScript *)in_stack_fffffffffffffe38);
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            *)in_stack_fffffffffffffe38);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe48,
               (pointer)in_stack_fffffffffffffe40,(unsigned_long)in_stack_fffffffffffffe38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe38);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffe78,
               (const_string *)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70),
               in_stack_fffffffffffffe68,(const_string *)in_stack_fffffffffffffe60);
    BaseSignatureChecker::BaseSignatureChecker((BaseSignatureChecker *)in_stack_fffffffffffffe38);
    EvalScript((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                *)in_stack_fffffffffffffe78,
               (CScript *)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70),
               (uint)(in_stack_fffffffffffffe68 >> 0x20),
               (BaseSignatureChecker *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c,
               in_stack_fffffffffffffe50);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffffe48,
               SUB81((ulong)in_stack_fffffffffffffe40 >> 0x38,0));
    in_stack_fffffffffffffe78 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe48,
               (pointer)in_stack_fffffffffffffe40,(unsigned_long)in_stack_fffffffffffffe38);
    boost::unit_test::operator<<
              (in_stack_fffffffffffffe40,(basic_cstring<const_char> *)in_stack_fffffffffffffe38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe48,
               (pointer)in_stack_fffffffffffffe40,(unsigned_long)in_stack_fffffffffffffe38);
    in_stack_fffffffffffffe38 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&stack0xffffffffffffff60,&local_c8,local_e8,1000,CHECK,CHECK_PRED
              );
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffffe38);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffe38);
    BaseSignatureChecker::~BaseSignatureChecker((BaseSignatureChecker *)in_stack_fffffffffffffe38);
    in_stack_fffffffffffffe77 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffffe77);
  do {
    line_num = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe48,
               (pointer)in_stack_fffffffffffffe40,(unsigned_long)in_stack_fffffffffffffe38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe38);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffe78,
               (const_string *)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70),
               line_num,(const_string *)in_stack_fffffffffffffe60);
    in_stack_fffffffffffffe60 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffffe40,(char (*) [1])in_stack_fffffffffffffe38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe48,
               (pointer)in_stack_fffffffffffffe40,(unsigned_long)in_stack_fffffffffffffe38);
    local_13c._vptr_lazy_ostream._0_4_ = 0x11;
    in_stack_fffffffffffffe48 = "SCRIPT_ERR_INVALID_STACK_OPERATION";
    in_stack_fffffffffffffe40 = &local_13c;
    in_stack_fffffffffffffe38 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x1e7b339;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,ScriptError_t,ScriptError_t>
              (local_128,(undefined1 *)((long)&local_13c._vptr_lazy_ostream + 4),0x3e9,1,2,local_64)
    ;
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffe38);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::~vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             *)in_stack_fffffffffffffe48);
  CScript::~CScript((CScript *)in_stack_fffffffffffffe38);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(script_cltv_truncated)
{
    const auto script_cltv_trunc = CScript() << OP_CHECKLOCKTIMEVERIFY;

    std::vector<std::vector<unsigned char>> stack_ignore;
    ScriptError err;
    BOOST_CHECK(!EvalScript(stack_ignore, script_cltv_trunc, SCRIPT_VERIFY_CHECKLOCKTIMEVERIFY, BaseSignatureChecker(), SigVersion::BASE, &err));
    BOOST_CHECK_EQUAL(err, SCRIPT_ERR_INVALID_STACK_OPERATION);
}